

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall cali::Log::perror(Log *this,char *__s)

{
  ostream *poVar1;
  char *pcVar2;
  int iVar3;
  char *in_RDX;
  char buf [120];
  
  if (LogImpl::s_instance == (LogImpl *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = LogImpl::s_instance->m_verbosity;
  }
  if (this->m_level <= iVar3) {
    poVar1 = get_stream(this);
    poVar1 = std::operator<<(poVar1,in_RDX);
    pcVar2 = strerror_r((int)__s,buf,0x78);
    std::operator<<(poVar1,pcVar2);
  }
  return;
}

Assistant:

std::ostream& Log::perror(int errnum, const char* msg)
{
    if (verbosity() < m_level)
        return m_nullstream;

#ifdef _GLIBCXX_HAVE_STRERROR_R
    char buf[120];
    return get_stream() << msg << strerror_r(errnum, buf, sizeof(buf));
#else
    return get_stream() << msg << strerror(errnum);
#endif
}